

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

TokenKind slang::syntax::SyntaxFacts::getSkipToKind(TokenKind kind)

{
  TokenKind kind_local;
  undefined2 local_2;
  
  if (kind == ApostropheOpenBrace) {
    local_2 = CloseBrace;
  }
  else if (kind == OpenBrace) {
    local_2 = CloseBrace;
  }
  else if (kind == OpenBracket) {
    local_2 = CloseBracket;
  }
  else if (kind == OpenParenthesis) {
    local_2 = CloseParenthesis;
  }
  else if (kind == BeginKeyword) {
    local_2 = EndKeyword;
  }
  else if (kind == CaseKeyword) {
    local_2 = EndCaseKeyword;
  }
  else if (kind == CheckerKeyword) {
    local_2 = EndCheckerKeyword;
  }
  else if (kind == ClassKeyword) {
    local_2 = EndClassKeyword;
  }
  else if (kind == ClockingKeyword) {
    local_2 = EndClockingKeyword;
  }
  else if (kind == ConfigKeyword) {
    local_2 = EndConfigKeyword;
  }
  else if (kind == CoverGroupKeyword) {
    local_2 = EndGroupKeyword;
  }
  else if (kind == ForkKeyword) {
    local_2 = JoinKeyword;
  }
  else if (kind == FunctionKeyword) {
    local_2 = EndFunctionKeyword;
  }
  else if (kind == GenerateKeyword) {
    local_2 = EndGenerateKeyword;
  }
  else if (kind == InterfaceKeyword) {
    local_2 = EndInterfaceKeyword;
  }
  else if (kind == MacromoduleKeyword) {
    local_2 = EndModuleKeyword;
  }
  else if (kind == ModuleKeyword) {
    local_2 = EndModuleKeyword;
  }
  else if (kind == PackageKeyword) {
    local_2 = EndPackageKeyword;
  }
  else if (kind == PrimitiveKeyword) {
    local_2 = EndPrimitiveKeyword;
  }
  else if (kind == ProgramKeyword) {
    local_2 = EndProgramKeyword;
  }
  else if (kind == PropertyKeyword) {
    local_2 = EndPropertyKeyword;
  }
  else if (kind == SequenceKeyword) {
    local_2 = EndSequenceKeyword;
  }
  else if (kind == SpecifyKeyword) {
    local_2 = EndSpecifyKeyword;
  }
  else if (kind == TableKeyword) {
    local_2 = EndTableKeyword;
  }
  else if (kind == TaskKeyword) {
    local_2 = EndTaskKeyword;
  }
  else {
    local_2 = Unknown;
  }
  return local_2;
}

Assistant:

parsing::TokenKind SyntaxFacts::getSkipToKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis: return TokenKind::CloseParenthesis;
        case TokenKind::OpenBrace: return TokenKind::CloseBrace;
        case TokenKind::OpenBracket: return TokenKind::CloseBracket;
        case TokenKind::ApostropheOpenBrace: return TokenKind::CloseBrace;
        case TokenKind::BeginKeyword: return TokenKind::EndKeyword;
        case TokenKind::CaseKeyword: return TokenKind::EndCaseKeyword;
        case TokenKind::CheckerKeyword: return TokenKind::EndCheckerKeyword;
        case TokenKind::ClassKeyword: return TokenKind::EndClassKeyword;
        case TokenKind::ClockingKeyword: return TokenKind::EndClockingKeyword;
        case TokenKind::ConfigKeyword: return TokenKind::EndConfigKeyword;
        case TokenKind::ForkKeyword: return TokenKind::JoinKeyword;
        case TokenKind::FunctionKeyword: return TokenKind::EndFunctionKeyword;
        case TokenKind::GenerateKeyword: return TokenKind::EndGenerateKeyword;
        case TokenKind::CoverGroupKeyword: return TokenKind::EndGroupKeyword;
        case TokenKind::InterfaceKeyword: return TokenKind::EndInterfaceKeyword;
        case TokenKind::ModuleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::MacromoduleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::PackageKeyword: return TokenKind::EndPackageKeyword;
        case TokenKind::PrimitiveKeyword: return TokenKind::EndPrimitiveKeyword;
        case TokenKind::ProgramKeyword: return TokenKind::EndProgramKeyword;
        case TokenKind::PropertyKeyword: return TokenKind::EndPropertyKeyword;
        case TokenKind::SpecifyKeyword: return TokenKind::EndSpecifyKeyword;
        case TokenKind::SequenceKeyword: return TokenKind::EndSequenceKeyword;
        case TokenKind::TableKeyword: return TokenKind::EndTableKeyword;
        case TokenKind::TaskKeyword: return TokenKind::EndTaskKeyword;
        default:
            return TokenKind::Unknown;
    }
}